

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O0

void __thiscall
baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>
          (sparse_matrix<int> *this,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts,int rows,int cols)

{
  pointer *this_00;
  int iVar1;
  int iVar2;
  size_type sVar3;
  size_type value_;
  bool bVar4;
  const_reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  int *piVar8;
  row_value *prVar9;
  iterator iVar10;
  iterator iVar11;
  col_value *pcVar12;
  size_type local_110;
  size_type local_10c;
  int i_6;
  int i_5;
  size_type local_100;
  int local_fc;
  int i_4;
  int nb_col;
  int col;
  fixed_array<int> cinit;
  size_type local_c4;
  row_value rStack_c0;
  int i_3;
  size_type local_b8;
  int local_b4;
  int i_2;
  int nb_row;
  int row;
  fixed_array<int> rinit;
  function_element *fct_elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range4;
  undefined1 local_70 [4];
  int i_1;
  vector<access,_std::allocator<access>_> accessors;
  fixed_array<baryonyx::sparse_matrix<int>::row_value> local_48;
  size_type local_38;
  size_type local_34;
  int e;
  int i;
  int elem;
  size_type local_20;
  size_type local_1c;
  int cols_local;
  int rows_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *csts_local;
  sparse_matrix<int> *this_local;
  
  local_20 = cols;
  local_1c = rows;
  _cols_local = csts;
  csts_local = (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                *)this;
  fixed_array<int>::fixed_array(&this->m_rows_access,rows + 1);
  fixed_array<int>::fixed_array(&this->m_cols_access,local_20 + 1);
  fixed_array<baryonyx::sparse_matrix<int>::row_value>::fixed_array(&this->m_rows_values);
  fixed_array<baryonyx::sparse_matrix<int>::col_value>::fixed_array(&this->m_cols_values);
  e = 0;
  local_38 = local_1c;
  for (local_34 = 0; local_34 != local_38; local_34 = local_34 + 1) {
    pvVar5 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](_cols_local,(long)(int)local_34);
    sVar6 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
            size(&pvVar5->elements);
    e = (int)sVar6 + e;
  }
  fixed_array<baryonyx::sparse_matrix<int>::row_value>::fixed_array(&local_48,e);
  fixed_array<baryonyx::sparse_matrix<int>::row_value>::swap(&local_48,&this->m_rows_values);
  fixed_array<baryonyx::sparse_matrix<int>::row_value>::~fixed_array(&local_48);
  fixed_array<baryonyx::sparse_matrix<int>::col_value>::fixed_array
            ((fixed_array<baryonyx::sparse_matrix<int>::col_value> *)
             &accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,e);
  this_00 = &accessors.super__Vector_base<access,_std::allocator<access>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  fixed_array<baryonyx::sparse_matrix<int>::col_value>::swap
            ((fixed_array<baryonyx::sparse_matrix<int>::col_value> *)this_00,&this->m_cols_values);
  fixed_array<baryonyx::sparse_matrix<int>::col_value>::~fixed_array
            ((fixed_array<baryonyx::sparse_matrix<int>::col_value> *)this_00);
  std::vector<access,_std::allocator<access>_>::vector
            ((vector<access,_std::allocator<access>_> *)local_70);
  std::vector<access,_std::allocator<access>_>::reserve
            ((vector<access,_std::allocator<access>_> *)local_70,(long)e);
  for (__range4._4_4_ = 0; __range4._4_4_ != local_1c; __range4._4_4_ = __range4._4_4_ + 1) {
    pvVar5 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](_cols_local,(long)(int)__range4._4_4_);
    __end0 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             begin(&pvVar5->elements);
    fct_elem = (function_element *)
               std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::end(&pvVar5->elements);
    while( true ) {
      bVar4 = __gnu_cxx::
              operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                        (&__end0,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                  *)&fct_elem);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      rinit._8_8_ = __gnu_cxx::
                    __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                    ::operator*(&__end0);
      std::
      vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
      ::emplace_back<int&,int_const&,baryonyx::function_element_const&>
                ((vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>
                  *)local_70,(int *)((long)&__range4 + 4),&((reference)rinit._8_8_)->variable_index,
                 (function_element *)rinit._8_8_);
      __gnu_cxx::
      __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
      ::operator++(&__end0);
    }
  }
  nb_row = 0;
  fixed_array<int>::fixed_array((fixed_array<int> *)&row,local_1c,&nb_row);
  pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                     ((vector<access,_std::allocator<access>_> *)local_70,0);
  i_2 = pvVar7->row;
  local_b4 = 0;
  for (local_b8 = 0; iVar2 = i_2, iVar1 = local_b4, local_b8 != e; local_b8 = local_b8 + 1) {
    pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                       ((vector<access,_std::allocator<access>_> *)local_70,(long)(int)local_b8);
    iVar1 = local_b4;
    if (iVar2 != pvVar7->row) {
      piVar8 = fixed_array<int>::operator[]((fixed_array<int> *)&row,i_2);
      *piVar8 = iVar1;
      local_b4 = 0;
      pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                         ((vector<access,_std::allocator<access>_> *)local_70,(long)(int)local_b8);
      i_2 = pvVar7->row;
    }
    sVar3 = local_b8;
    local_b4 = local_b4 + 1;
    pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                       ((vector<access,_std::allocator<access>_> *)local_70,(long)(int)local_b8);
    value_ = local_b8;
    pvVar7->id = sVar3;
    pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                       ((vector<access,_std::allocator<access>_> *)local_70,(long)(int)local_b8);
    row_value::row_value(&stack0xffffffffffffff40,value_,pvVar7->col);
    prVar9 = fixed_array<baryonyx::sparse_matrix<int>::row_value>::operator[]
                       (&this->m_rows_values,local_b8);
    *prVar9 = rStack_c0;
  }
  piVar8 = fixed_array<int>::operator[]((fixed_array<int> *)&row,i_2);
  *piVar8 = iVar1;
  local_c4 = 0;
  while( true ) {
    if (local_c4 == local_1c) {
      iVar10 = std::vector<access,_std::allocator<access>_>::begin
                         ((vector<access,_std::allocator<access>_> *)local_70);
      iVar11 = std::vector<access,_std::allocator<access>_>::end
                         ((vector<access,_std::allocator<access>_> *)local_70);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access*,std::vector<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access,std::allocator<baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::access>>>,baryonyx::sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>
                (iVar10._M_current,iVar11._M_current);
      nb_col = 0;
      fixed_array<int>::fixed_array((fixed_array<int> *)&col,local_20,&nb_col);
      pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                         ((vector<access,_std::allocator<access>_> *)local_70,0);
      i_4 = pvVar7->col;
      local_fc = 0;
      for (local_100 = 0; iVar2 = i_4, iVar1 = local_fc, local_100 != e; local_100 = local_100 + 1)
      {
        pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                           ((vector<access,_std::allocator<access>_> *)local_70,(long)(int)local_100
                           );
        iVar1 = local_fc;
        if (iVar2 != pvVar7->col) {
          piVar8 = fixed_array<int>::operator[]((fixed_array<int> *)&col,i_4);
          *piVar8 = iVar1;
          local_fc = 0;
          pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                             ((vector<access,_std::allocator<access>_> *)local_70,
                              (long)(int)local_100);
          i_4 = pvVar7->col;
        }
        local_fc = local_fc + 1;
        pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                           ((vector<access,_std::allocator<access>_> *)local_70,(long)(int)local_100
                           );
        prVar9 = fixed_array<baryonyx::sparse_matrix<int>::row_value>::operator[]
                           (&this->m_rows_values,pvVar7->id);
        iVar1 = prVar9->value;
        pvVar7 = std::vector<access,_std::allocator<access>_>::operator[]
                           ((vector<access,_std::allocator<access>_> *)local_70,(long)(int)local_100
                           );
        col_value::col_value((col_value *)&i_6,iVar1,pvVar7->row);
        pcVar12 = fixed_array<baryonyx::sparse_matrix<int>::col_value>::operator[]
                            (&this->m_cols_values,local_100);
        *pcVar12 = _i_6;
      }
      piVar8 = fixed_array<int>::operator[]((fixed_array<int> *)&col,i_4);
      *piVar8 = iVar1;
      piVar8 = fixed_array<int>::operator[](&this->m_rows_access,0);
      *piVar8 = 0;
      for (local_10c = 0; local_10c != local_1c; local_10c = local_10c + 1) {
        piVar8 = fixed_array<int>::operator[](&this->m_rows_access,local_10c);
        iVar1 = *piVar8;
        piVar8 = fixed_array<int>::operator[]((fixed_array<int> *)&row,local_10c);
        iVar2 = *piVar8;
        piVar8 = fixed_array<int>::operator[](&this->m_rows_access,local_10c + 1);
        *piVar8 = iVar1 + iVar2;
      }
      piVar8 = fixed_array<int>::operator[](&this->m_cols_access,0);
      *piVar8 = 0;
      for (local_110 = 0; local_110 != local_20; local_110 = local_110 + 1) {
        piVar8 = fixed_array<int>::operator[](&this->m_cols_access,local_110);
        iVar1 = *piVar8;
        piVar8 = fixed_array<int>::operator[]((fixed_array<int> *)&col,local_110);
        iVar2 = *piVar8;
        piVar8 = fixed_array<int>::operator[](&this->m_cols_access,local_110 + 1);
        *piVar8 = iVar1 + iVar2;
      }
      fixed_array<int>::~fixed_array((fixed_array<int> *)&col);
      fixed_array<int>::~fixed_array((fixed_array<int> *)&row);
      std::vector<access,_std::allocator<access>_>::~vector
                ((vector<access,_std::allocator<access>_> *)local_70);
      return;
    }
    piVar8 = fixed_array<int>::operator[]((fixed_array<int> *)&row,local_c4);
    iVar1 = *piVar8;
    pvVar5 = std::
             vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             ::operator[](_cols_local,(long)(int)local_c4);
    sVar6 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
            size(&pvVar5->elements);
    if (iVar1 != (int)sVar6) break;
    local_c4 = local_c4 + 1;
  }
  details::fail_fast("Assertion","rinit[i] == static_cast<int>(csts[i].elements.size())",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/sparse-matrix.hpp"
                     ,"151");
}

Assistant:

explicit sparse_matrix(const std::vector<Constraint>& csts,
                           const int rows,
                           const int cols)
      : m_rows_access(rows + 1)
      , m_cols_access(cols + 1)
    {
        int elem = 0;

        for (int i = 0, e = rows; i != e; ++i)
            elem += static_cast<int>(csts[i].elements.size());

        row_vector_access(elem).swap(m_rows_values);
        col_vector_access(elem).swap(m_cols_values);

        //
        // First, we build a vector of access to all elements in the matrix
        // different to 0. Then, we sort accessors according to the column id
        // then we assign a unique identifier for each accessors and then we
        // sort accessors according to the row id. This code enable the
        // construction of the r_rows_values with pointers to the
        // r_cols_values.
        //

        struct access
        {
            access() = default;

            access(int row_, int col_, function_element fct_)
              : row(row_)
              , col(col_)
              , fct(fct_)
            {}

            int row;
            int col;
            int id;
            function_element fct;
        };

        std::vector<access> accessors;
        accessors.reserve(elem);
        for (int i = 0; i != rows; ++i)
            for (const auto& fct_elem : csts[i].elements)
                accessors.emplace_back(i, fct_elem.variable_index, fct_elem);

        fixed_array<int> rinit(rows, 0);
        int row = accessors[0].row;
        int nb_row = 0;
        for (int i = 0; i != elem; ++i) {
            if (row != accessors[i].row) {
                rinit[row] = nb_row;
                nb_row = 0;
                row = accessors[i].row;
            }
            ++nb_row;

            accessors[i].id = i;
            m_rows_values[i] = { i, accessors[i].col };
        }

        rinit[row] = nb_row; /* Be sure to affect the good number of elements
                                for this constaints. */

        for (int i = 0; i != rows; ++i)
            bx_assert(rinit[i] == static_cast<int>(csts[i].elements.size()));

        // We sort the accessors to improve memory friendly access.

        std::stable_sort(
          accessors.begin(),
          accessors.end(),
          [](const auto& lhs, const auto& rhs) { return lhs.col < rhs.col; });

        fixed_array<int> cinit(cols, 0);
        int col = accessors[0].col;
        int nb_col = 0;

        for (int i = 0; i != elem; ++i) {
            if (col != accessors[i].col) {
                cinit[col] = nb_col;
                nb_col = 0;
                col = accessors[i].col;
            }
            ++nb_col;

            m_cols_values[i] = { m_rows_values[accessors[i].id].value,
                                 accessors[i].row };
        }

        cinit[col] = nb_col; /* Be sure to affect the good number of elements
                                for this constaints. */

        m_rows_access[0] = 0;
        for (int i = 0; i != rows; ++i)
            m_rows_access[i + 1] = m_rows_access[i] + rinit[i];

        m_cols_access[0] = 0;
        for (int i = 0; i != cols; ++i)
            m_cols_access[i + 1] = m_cols_access[i] + cinit[i];
    }